

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

int scale_expansion(int elen,double *e,double b,double *h)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = splitter;
  dVar5 = splitter * b - (splitter * b - b);
  dVar6 = b - dVar5;
  dVar8 = *e;
  dVar4 = dVar8 * b;
  dVar7 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  *h = (dVar8 - dVar7) * dVar6 -
       (((dVar4 - dVar7 * dVar5) - (dVar8 - dVar7) * dVar5) - dVar7 * dVar6);
  lVar3 = 1;
  if (1 < elen) {
    lVar2 = 2;
    do {
      lVar3 = lVar2;
      dVar8 = *(double *)((long)e + lVar3 * 4);
      dVar7 = dVar8 * b;
      dVar9 = dVar1 * dVar8 - (dVar1 * dVar8 - dVar8);
      dVar8 = (dVar8 - dVar9) * dVar6 -
              (((dVar7 - dVar9 * dVar5) - (dVar8 - dVar9) * dVar5) - dVar9 * dVar6);
      dVar9 = dVar4 + dVar8;
      h[lVar3 + -1] = (dVar4 - (dVar9 - (dVar9 - dVar4))) + (dVar8 - (dVar9 - dVar4));
      dVar4 = dVar7 + dVar9;
      h[lVar3] = (dVar7 - (dVar4 - (dVar4 - dVar7))) + (dVar9 - (dVar4 - dVar7));
      lVar2 = lVar3 + 2;
    } while ((ulong)(uint)elen * 2 != lVar3 + 2);
    lVar3 = lVar3 + 1;
  }
  h[lVar3] = dVar4;
  return elen * 2;
}

Assistant:

int scale_expansion(int elen, REAL *e, REAL b, REAL *h)
/* e and h cannot be the same. */
{
  INEXACT REAL Q;
  INEXACT REAL sum;
  INEXACT REAL product1;
  REAL product0;
  int eindex, hindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;

  Split(b, bhi, blo);
  Two_Product_Presplit(e[0], b, bhi, blo, Q, h[0]);
  hindex = 1;
  for (eindex = 1; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Product_Presplit(enow, b, bhi, blo, product1, product0);
    Two_Sum(Q, product0, sum, h[hindex]);
    hindex++;
    Two_Sum(product1, sum, Q, h[hindex]);
    hindex++;
  }
  h[hindex] = Q;
  return elen + elen;
}